

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O2

void __thiscall
FileReceiverServerConnection::OnClose(FileReceiverServerConnection *this,SDKJsonResult *reason)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  string asStack_238 [32];
  TonkStatusEx local_218;
  LogStringBuffer local_198;
  
  tonk::SDKConnection::GetStatusEx(&local_218,&this->super_SDKConnection);
  std::__cxx11::string::string(asStack_238,(string *)&reason->ErrorJson);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = Logger.ChannelName;
    local_198.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
    std::operator<<((ostream *)this_00,"Rendezvous server connection closed: ");
    std::operator<<((ostream *)this_00,local_218.Remote.NetworkString);
    std::operator<<((ostream *)this_00,", Reason: ");
    std::operator<<((ostream *)this_00,asStack_238);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  std::__cxx11::string::~string(asStack_238);
  return;
}

Assistant:

void FileReceiverServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("Rendezvous server connection closed: ",
        GetStatusEx().Remote.NetworkString, ", Reason: ", reason.ToString());
}